

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

int __thiscall Darts::Details::DawgBuilder::init(DawgBuilder *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  uint local_10 [2];
  
  local_10[1] = 0;
  AutoPool<unsigned_int>::resize(&this->table_,0x400,local_10 + 1);
  append_node(this);
  append_unit(this);
  this->num_states_ = 1;
  (this->nodes_).buf_.array_[8] = -1;
  local_10[0] = 0;
  AutoPool<unsigned_int>::append(&(this->node_stack_).pool_,local_10);
  return extraout_EAX;
}

Assistant:

inline void DawgBuilder::init() {
  table_.resize(INITIAL_TABLE_SIZE, 0);

  append_node();
  append_unit();

  num_states_ = 1;

  nodes_[0].set_label(0xFF);
  node_stack_.push(0);
}